

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_thisSymbolValue(JSContext *ctx,JSValue this_val)

{
  int64_t iVar1;
  JSRefCountHeader *p;
  JSValueUnion JVar2;
  JSValue JVar3;
  
  iVar1 = this_val.tag;
  JVar2 = this_val.u;
  if ((int)this_val.tag == -1) {
    if ((*(short *)((long)JVar2.ptr + 6) != 7) ||
       (iVar1 = *(int64_t *)((long)JVar2.ptr + 0x38), (int)iVar1 != -8)) goto LAB_0015a801;
    JVar2 = (JSValueUnion)((JSValueUnion *)((long)JVar2.ptr + 0x30))->ptr;
  }
  else if ((int)this_val.tag != -8) {
LAB_0015a801:
    JVar2.float64 = 0.0;
    JS_ThrowTypeError(ctx,"not a symbol");
    iVar1 = 6;
    goto LAB_0015a814;
  }
  *(int *)JVar2.ptr = *JVar2.ptr + 1;
LAB_0015a814:
  JVar3.tag = iVar1;
  JVar3.u.ptr = JVar2.ptr;
  return JVar3;
}

Assistant:

static JSValue js_thisSymbolValue(JSContext *ctx, JSValueConst this_val)
{
    if (JS_VALUE_GET_TAG(this_val) == JS_TAG_SYMBOL)
        return JS_DupValue(ctx, this_val);

    if (JS_VALUE_GET_TAG(this_val) == JS_TAG_OBJECT) {
        JSObject *p = JS_VALUE_GET_OBJ(this_val);
        if (p->class_id == JS_CLASS_SYMBOL) {
            if (JS_VALUE_GET_TAG(p->u.object_data) == JS_TAG_SYMBOL)
                return JS_DupValue(ctx, p->u.object_data);
        }
    }
    return JS_ThrowTypeError(ctx, "not a symbol");
}